

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,UsdPreviewSurface *surf,uint32_t indent,
          bool closing_brace)

{
  ostream *poVar1;
  uint32_t indent_00;
  uint32_t n;
  uint32_t n_00;
  stringstream ss;
  string sStack_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  indent_00 = indent;
  std::__cxx11::stringstream::stringstream(local_1b8);
  pprint::Indent_abi_cxx11_(&sStack_1d8,(pprint *)((ulong)surf & 0xffffffff),n);
  poVar1 = std::operator<<(local_1a8,(string *)&sStack_1d8);
  std::operator<<(poVar1,"{\n");
  std::__cxx11::string::_M_dispose();
  print_shader_params_abi_cxx11_
            (&sStack_1d8,this,(UsdPreviewSurface *)((ulong)surf & 0xffffffff),indent_00);
  std::operator<<(local_1a8,(string *)&sStack_1d8);
  std::__cxx11::string::_M_dispose();
  if (indent != 0) {
    pprint::Indent_abi_cxx11_(&sStack_1d8,(pprint *)((ulong)surf & 0xffffffff),n_00);
    poVar1 = std::operator<<(local_1a8,(string *)&sStack_1d8);
    std::operator<<(poVar1,"}\n");
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const UsdPreviewSurface &surf, const uint32_t indent,
                      bool closing_brace) {
  // TODO: Print spec and meta?
  std::stringstream ss;

  ss << pprint::Indent(indent) << "{\n";
  ss << print_shader_params(surf, indent);
  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}